

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void kj::anon_unknown_36::requireValidHeaderValue(StringPtr value)

{
  size_t in_RDX;
  StringPtr value_00;
  ArrayPtr<const_char> text;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Array<char> local_30;
  
  value_00.content.ptr = (char *)value.content.size_;
  value_00.content.size_ = in_RDX;
  _kjCondition.value = HttpHeaders::isValidHeaderValue((HttpHeaders *)value.content.ptr,value_00);
  if (_kjCondition.value) {
    return;
  }
  text.size_ = (size_t)(value_00.content.ptr + -1);
  text.ptr = value.content.ptr;
  encodeCEscape((String *)&local_30,text);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21],kj::String>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f6,FAILED,"HttpHeaders::isValidHeaderValue(value)",
             "_kjCondition,\"invalid header value\", kj::encodeCEscape(value)",&_kjCondition,
             (char (*) [21])"invalid header value",(String *)&local_30);
  Array<char>::~Array(&local_30);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static void requireValidHeaderValue(kj::StringPtr value) {
  KJ_REQUIRE(HttpHeaders::isValidHeaderValue(value), "invalid header value",
      kj::encodeCEscape(value));
}